

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiQuaternion __thiscall
Assimp::FBX::FBXConverter::EulerToQuaternion(FBXConverter *this,aiVector3D *rot,RotOrder order)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  aiQuaternion aVar11;
  aiMatrix4x4 m;
  aiMatrix4x4 local_48;
  
  local_48.a1 = 1.0;
  local_48.a2 = 0.0;
  local_48.a3 = 0.0;
  local_48.a4 = 0.0;
  local_48.b1 = 0.0;
  local_48.b2 = 1.0;
  local_48.b3 = 0.0;
  local_48.b4 = 0.0;
  local_48.c1 = 0.0;
  local_48.c2 = 0.0;
  local_48.c3 = 1.0;
  local_48.c4 = 0.0;
  local_48.d1 = 0.0;
  local_48.d2 = 0.0;
  local_48.d3 = 0.0;
  local_48.d4 = 1.0;
  GetRotationMatrix(this,order,rot,&local_48);
  fVar1 = local_48.a2;
  fVar2 = local_48.a3;
  fVar3 = local_48.b1;
  fVar4 = local_48.b3;
  fVar5 = local_48.c1;
  fVar6 = local_48.c2;
  fVar8 = local_48.a1 + local_48.b2 + local_48.c3;
  if (fVar8 <= 0.0) {
    if ((local_48.a1 <= local_48.b2) || (local_48.a1 <= local_48.c3)) {
      if (local_48.b2 <= local_48.c3) {
        fVar8 = ((local_48.c3 + 1.0) - local_48.a1) - local_48.b2;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        fVar8 = fVar8 + fVar8;
        fVar9 = (fVar2 + fVar5) / fVar8;
        fVar7 = (fVar4 + fVar6) / fVar8;
        fVar10 = fVar8 * 0.25;
        fVar8 = (fVar3 - fVar1) / fVar8;
      }
      else {
        fVar8 = ((local_48.b2 + 1.0) - local_48.a1) - local_48.c3;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        fVar8 = fVar8 + fVar8;
        fVar9 = (fVar1 + fVar3) / fVar8;
        fVar7 = fVar8 * 0.25;
        fVar10 = (fVar4 + fVar6) / fVar8;
        fVar8 = (fVar2 - fVar5) / fVar8;
      }
    }
    else {
      fVar8 = ((local_48.a1 + 1.0) - local_48.b2) - local_48.c3;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar8 = fVar8 + fVar8;
      fVar9 = fVar8 * 0.25;
      fVar7 = (fVar1 + fVar3) / fVar8;
      fVar10 = (fVar2 + fVar5) / fVar8;
      fVar8 = (fVar6 - fVar4) / fVar8;
    }
  }
  else {
    fVar8 = fVar8 + 1.0;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar8 = fVar8 + fVar8;
    fVar9 = (fVar6 - fVar4) / fVar8;
    fVar7 = (fVar2 - fVar5) / fVar8;
    fVar10 = (fVar3 - fVar1) / fVar8;
    fVar8 = fVar8 * 0.25;
  }
  aVar11.x = fVar9;
  aVar11.w = fVar8;
  aVar11.z = fVar10;
  aVar11.y = fVar7;
  return aVar11;
}

Assistant:

aiQuaternion FBXConverter::EulerToQuaternion(const aiVector3D& rot, Model::RotOrder order)
        {
            aiMatrix4x4 m;
            GetRotationMatrix(order, rot, m);

            return aiQuaternion(aiMatrix3x3(m));
        }